

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O3

void __thiscall
NewFunctionProcessingVisitor::TraverseToChildByIndex(NewFunctionProcessingVisitor *this)

{
  int iVar1;
  NewScopeLayer *pNVar2;
  pointer ppNVar3;
  runtime_error *this_00;
  
  pNVar2 = this->current_layer_;
  iVar1 = pNVar2->traverse_index;
  ppNVar3 = (pNVar2->children_).
            super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)iVar1 <
      (ulong)((long)(pNVar2->children_).
                    super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3)) {
    pNVar2->traverse_index = iVar1 + 1;
    this->current_layer_ = ppNVar3[iVar1];
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error while traversing...");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewFunctionProcessingVisitor::TraverseToChildByIndex() {
  if (current_layer_->traverse_index >= current_layer_->children_.size()) {
    throw std::runtime_error("Error while traversing...");
  }

  ++current_layer_->traverse_index;
  current_layer_ =
      current_layer_->children_[current_layer_->traverse_index - 1];
}